

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall CompressedXipReader::~CompressedXipReader(CompressedXipReader *this)

{
  pointer *ppuVar1;
  size_t datasize;
  bool bVar2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  reference compdata_00;
  size_type sVar6;
  size_type sVar7;
  element_type *peVar8;
  iterator __first;
  iterator __last;
  reference pvVar9;
  value_type_conflict3 local_64;
  size_t local_60;
  size_t c;
  size_t n;
  undefined1 local_48 [8];
  ByteVector data;
  ByteVector compdata;
  CompressedXipReader *this_local;
  
  (this->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__CompressedXipReader_0019b800;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_memrd);
  if (bVar2) {
    peVar5 = std::__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_memrd);
    (*(peVar5->super_ReadWriter)._vptr_ReadWriter[4])(peVar5,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      peVar5 = std::__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_memrd);
      iVar3 = (*(peVar5->super_ReadWriter)._vptr_ReadWriter[8])();
      if ((((byte)iVar3 ^ 0xff) & 1) == 0) break;
      uVar4 = this->_fullblocksize;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&n + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,(ulong)uVar4,
                 (allocator<unsigned_char> *)((long)&n + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&n + 7));
      peVar5 = std::__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_memrd);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
      iVar3 = (*(peVar5->super_ReadWriter)._vptr_ReadWriter[2])(peVar5,pvVar9,sVar6);
      c = CONCAT44(extraout_var,iVar3);
      ppuVar1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,
                 sVar6 + this->_fullblocksize);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
      datasize = c;
      ppuVar1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      compdata_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,
                               sVar6 - this->_fullblocksize);
      local_60 = compress(this,pvVar9,datasize,compdata_00);
      ppuVar1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,
                 (sVar6 - this->_fullblocksize) + local_60);
      local_64 = (value_type_conflict3)local_60;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->_compsizes,&local_64);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    }
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_compsizes);
    peVar5 = std::__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_memrd);
    uVar4 = (*(peVar5->super_ReadWriter)._vptr_ReadWriter[6])();
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    printf("updated cxip: %d blocks ( full=%x, comp=%x )\n",sVar6 & 0xffffffff,(ulong)uVar4,
           sVar7 & 0xffffffff);
    peVar8 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    (*peVar8->_vptr_ReadWriter[4])(peVar8,0x34);
    peVar8 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_compsizes);
    ReadWriter::write32le(peVar8,(int)sVar6 * 2 + 0x44);
    peVar8 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_compsizes);
    ReadWriter::write32le(peVar8,(uint32_t)sVar6);
    peVar8 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    ReadWriter::write32le(peVar8,this->_fullblocksize);
    peVar8 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    ReadWriter::write32le(peVar8,0x58505253);
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_compsizes);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->_compsizes);
    std::
    for_each<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,CompressedXipReader::~CompressedXipReader()::_lambda(unsigned_int)_1_>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current,(anon_class_8_1_8991fb9c)this);
    peVar8 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    ppuVar1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,0);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
    (*peVar8->_vptr_ReadWriter[3])(peVar8,pvVar9,sVar6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::shared_ptr<MemoryReader>::~shared_ptr(&this->_memrd);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_cache);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->_compsizes);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->_compptrs);
  std::shared_ptr<ReadWriter>::~shared_ptr(&this->_r);
  ReadWriter::~ReadWriter(&this->super_ReadWriter);
  return;
}

Assistant:

virtual ~CompressedXipReader()
    {
        if (!_memrd)
            return;

        // create new compressed data
        _memrd->setpos(0);
        ByteVector compdata;

        while (!_memrd->eof()) {
            ByteVector data(_fullblocksize);
            size_t n= _memrd->read(&data[0], data.size());

            compdata.resize(compdata.size()+_fullblocksize);
            size_t c= compress(&data[0], n, &compdata[compdata.size()-_fullblocksize]);
            compdata.resize(compdata.size()-_fullblocksize+c);

            _compsizes.push_back(c);
        }
        printf("updated cxip: %d blocks ( full=%x, comp=%x )\n", (int)_compsizes.size(), (int)_memrd->size(), (int)compdata.size());

        // write new header
        _r->setpos(0x34);
        _r->write32le(0x44+2*_compsizes.size());
        _r->write32le(_compsizes.size());
        _r->write32le(_fullblocksize);
        _r->write32le(0x58505253);
        std::for_each(_compsizes.begin(), _compsizes.end(), [this](uint32_t c) { _r->write16le(c); });
        _r->write(&compdata[0], compdata.size());
    }